

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSet.cpp
# Opt level: O2

cstr idx2::ToString(metadata *Meta)

{
  uint __line;
  int iVar1;
  int iVar2;
  char *pcVar3;
  long *in_FS_OFFSET;
  stref sVar4;
  printer Pr;
  
  pcVar3 = (char *)(*in_FS_OFFSET + -0x580);
  printer::printer(&Pr,pcVar3,0x180);
  if (Pr.File == (FILE *)0x0 && Pr.Buf != (char *)0x0) {
    if ((long)Pr.Size < 2) {
      pcVar3 = "false && \"buffer too small\"";
    }
    else {
      iVar1 = snprintf(Pr.Buf,(long)Pr.Size,"name = %s\n",Meta);
      Pr.Buf = Pr.Buf + iVar1;
      iVar2 = Pr.Size - iVar1;
      if (Pr.Size - iVar1 != 0 && iVar1 <= Pr.Size) goto LAB_00108384;
      pcVar3 = "false && \"buffer overflow?\"";
    }
  }
  else {
    if ((Pr.Buf == (char *)0x0) && (Pr.File != (FILE *)0x0)) {
      fprintf((FILE *)Pr.File,"name = %s\n",Meta);
      iVar2 = Pr.Size;
LAB_00108384:
      Pr.Size = iVar2;
      if (Pr.File == (FILE *)0x0 && Pr.Buf != (char *)0x0) {
        if ((long)Pr.Size < 2) {
          pcVar3 = "false && \"buffer too small\"";
        }
        else {
          iVar1 = snprintf(Pr.Buf,(long)Pr.Size,"field = %s\n",Meta->Field);
          Pr.Buf = Pr.Buf + iVar1;
          iVar2 = Pr.Size - iVar1;
          if (Pr.Size - iVar1 != 0 && iVar1 <= Pr.Size) goto LAB_00108408;
          pcVar3 = "false && \"buffer overflow?\"";
        }
      }
      else {
        if ((Pr.Buf == (char *)0x0) && (Pr.File != (FILE *)0x0)) {
          fprintf((FILE *)Pr.File,"field = %s\n",Meta->Field);
          iVar2 = Pr.Size;
LAB_00108408:
          Pr.Size = iVar2;
          if (Pr.File == (FILE *)0x0 && Pr.Buf != (char *)0x0) {
            if ((long)Pr.Size < 2) {
              pcVar3 = "false && \"buffer too small\"";
            }
            else {
              iVar1 = snprintf(Pr.Buf,(long)Pr.Size,"dimensions = %d %d %d\n",
                               (ulong)(uint)(Meta->Dims3).field_0.field_0.X,
                               (ulong)(uint)(Meta->Dims3).field_0.field_0.Y,
                               (ulong)(uint)(Meta->Dims3).field_0.field_0.Z);
              Pr.Buf = Pr.Buf + iVar1;
              iVar2 = Pr.Size - iVar1;
              if (Pr.Size - iVar1 != 0 && iVar1 <= Pr.Size) goto LAB_001084a1;
              pcVar3 = "false && \"buffer overflow?\"";
            }
          }
          else {
            if ((Pr.Buf == (char *)0x0) && (Pr.File != (FILE *)0x0)) {
              fprintf((FILE *)Pr.File,"dimensions = %d %d %d\n",
                      (ulong)(uint)(Meta->Dims3).field_0.field_0.X,
                      (ulong)(uint)(Meta->Dims3).field_0.field_0.Y,
                      (ulong)(uint)(Meta->Dims3).field_0.field_0.Z);
              iVar2 = Pr.Size;
LAB_001084a1:
              Pr.Size = iVar2;
              sVar4 = ToString(Meta->DType);
              if (Pr.File == (FILE *)0x0 && Pr.Buf != (char *)0x0) {
                if ((long)Pr.Size < 2) {
                  pcVar3 = "false && \"buffer too small\"";
                }
                else {
                  iVar2 = snprintf(Pr.Buf,(long)Pr.Size,"data type = %.*s",sVar4._8_8_ & 0xffffffff,
                                   sVar4.field_0.Ptr);
                  Pr.Buf = Pr.Buf + iVar2;
                  if (iVar2 < Pr.Size) {
                    return pcVar3;
                  }
                  pcVar3 = "false && \"buffer overflow?\"";
                }
              }
              else {
                if ((Pr.Buf == (char *)0x0) && (Pr.File != (FILE *)0x0)) {
                  fprintf((FILE *)Pr.File,"data type = %.*s",sVar4._8_8_ & 0xffffffff,
                          sVar4.field_0.Ptr);
                  return pcVar3;
                }
                pcVar3 = "false && \"unavailable or ambiguous printer destination\"";
              }
              __line = 0x28;
              goto LAB_001085de;
            }
            pcVar3 = "false && \"unavailable or ambiguous printer destination\"";
          }
          __line = 0x26;
          goto LAB_001085de;
        }
        pcVar3 = "false && \"unavailable or ambiguous printer destination\"";
      }
      __line = 0x25;
      goto LAB_001085de;
    }
    pcVar3 = "false && \"unavailable or ambiguous printer destination\"";
  }
  __line = 0x24;
LAB_001085de:
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                ,__line,"cstr idx2::ToString(const metadata &)");
}

Assistant:

cstr
ToString(const metadata& Meta)
{
  printer Pr(Meta.String, sizeof(Meta.String));
  idx2_Print(&Pr, "name = %s\n", Meta.Name);
  idx2_Print(&Pr, "field = %s\n", Meta.Field);
  idx2_Print(&Pr, "dimensions = %d %d %d\n", Meta.Dims3.X, Meta.Dims3.Y, Meta.Dims3.Z);
  stref TypeStr = ToString(Meta.DType);
  idx2_Print(&Pr, "data type = %.*s", TypeStr.Size, TypeStr.Ptr);

  return Meta.String;
}